

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall
QXmlStreamReaderPrivate::checkPublicLiteral(QXmlStreamReaderPrivate *this,QStringView publicId)

{
  bool bVar1;
  storage_type_conflict *psVar2;
  long in_FS_OFFSET;
  qsizetype i;
  uchar c;
  char16_t *data;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  QXmlStreamReaderPrivate *in_stack_ffffffffffffff50;
  char *sourceText;
  int fieldWidth;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 uVar3;
  QString *in_stack_ffffffffffffff70;
  long local_70;
  byte in_stack_ffffffffffffff9e;
  QChar fillChar;
  QChar local_4e;
  QLatin1Char local_4b;
  undefined1 local_4a [2];
  char local_48 [48];
  QStringView local_18;
  long local_8;
  QLatin1Char ch;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  psVar2 = QStringView::utf16(&local_18);
  fillChar.ucs = (char16_t)in_stack_ffffffffffffff9e;
  local_70 = QStringView::size(&local_18);
  do {
    local_70 = local_70 + -1;
    if ((local_70 < 0) || (0xff < (ushort)psVar2[local_70])) goto LAB_00643047;
    fillChar.ucs = CONCAT11((byte)psVar2[local_70],(char)fillChar.ucs);
    in_stack_ffffffffffffff70 = (QString *)(ulong)((byte)psVar2[local_70] - 10);
    switch(in_stack_ffffffffffffff70) {
    case (QString *)0x0:
    case (QString *)0x3:
    case (QString *)0x16:
    case (QString *)0x17:
    case (QString *)0x18:
    case (QString *)0x19:
    case (QString *)0x1a:
    case (QString *)0x1b:
    case (QString *)0x1d:
    case (QString *)0x1e:
    case (QString *)0x1f:
    case (QString *)0x20:
    case (QString *)0x21:
    case (QString *)0x22:
    case (QString *)0x23:
    case (QString *)0x24:
    case (QString *)0x25:
    case (QString *)0x30:
    case (QString *)0x31:
    case (QString *)0x33:
    case (QString *)0x35:
    case (QString *)0x36:
    case (QString *)0x55:
      break;
    default:
      bVar1 = QtMiscUtils::isAsciiLetterOrNumber(L'\0');
      if (!bVar1) {
LAB_00643047:
        if (-1 < local_70) {
          uVar3 = 0;
          sourceText = local_48;
          QXmlStream::tr(sourceText,(char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
          ch.ch = (char)((ulong)sourceText >> 0x38);
          QLatin1Char::QLatin1Char(&local_4b,(char)((ushort)fillChar.ucs >> 8));
          fieldWidth = (int)((ulong)local_4a >> 0x20);
          QChar::QChar<QLatin1Char,_true>((QChar *)in_stack_ffffffffffffff50,ch);
          QChar::QChar<char16_t,_true>(&local_4e,L' ');
          QString::arg<QChar,_true>
                    (in_stack_ffffffffffffff70,(QChar *)CONCAT44(uVar3,in_stack_ffffffffffffff68),
                     fieldWidth,fillChar);
          raiseWellFormedError
                    (in_stack_ffffffffffffff50,
                     (QString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          QString::~QString((QString *)0x6430ec);
          QString::~QString((QString *)0x6430f6);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          return;
        }
        __stack_chk_fail();
      }
    }
  } while( true );
}

Assistant:

void QXmlStreamReaderPrivate::checkPublicLiteral(QStringView publicId)
{
//#x20 | #xD | #xA | [a-zA-Z0-9] | [-'()+,./:=?;!*#@$_%]

    const char16_t *data = publicId.utf16();
    uchar c = 0;
    qsizetype i;
    for (i = publicId.size() - 1; i >= 0; --i) {
        if (data[i] < 256)
            switch ((c = data[i])) {
            case ' ': case '\n': case '\r': case '-': case '(': case ')':
            case '+': case ',': case '.': case '/': case ':': case '=':
            case '?': case ';': case '!': case '*': case '#': case '@':
            case '$': case '_': case '%': case '\'': case '\"':
                continue;
            default:
                if (isAsciiLetterOrNumber(c))
                    continue;
            }
        break;
    }
    if (i >= 0)
        raiseWellFormedError(QXmlStream::tr("Unexpected character '%1' in public id literal.").arg(QChar(QLatin1Char(c))));
}